

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mingw_make.cpp
# Opt level: O1

void __thiscall
MingwMakefileGenerator::writeObjectsPart(MingwMakefileGenerator *this,QTextStream *t)

{
  int iVar1;
  QArrayData *pQVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  QMakeProject *pQVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QStringView config;
  QArrayData *local_198;
  char16_t *pcStack_190;
  qsizetype local_188;
  ProKey local_178;
  QArrayData *local_148;
  char16_t *pcStack_140;
  qsizetype local_138;
  QString local_128;
  QArrayData local_108;
  char16_t *local_f8;
  ProKey local_e8;
  ProString local_b8;
  undefined1 local_88 [16];
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  char (*local_60) [3];
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MakefileGenerator::maybeCreateLinkerResponseFile
            ((LinkerResponseFileInfo *)local_88,(MakefileGenerator *)this);
  pQVar2 = &((this->linkerResponseFile).filePath.d.d)->super_QArrayData;
  pQVar3 = (QArrayData *)(this->linkerResponseFile).filePath.d.ptr;
  (this->linkerResponseFile).filePath.d.d = (Data *)local_88._0_8_;
  (this->linkerResponseFile).filePath.d.ptr = (char16_t *)local_88._8_8_;
  pQVar4 = (QArrayData *)(this->linkerResponseFile).filePath.d.size;
  (this->linkerResponseFile).filePath.d.size = (qsizetype)local_78;
  (this->linkerResponseFile).onlyObjects = pcStack_70._0_1_;
  local_88._0_8_ = pQVar2;
  local_88._8_8_ = pQVar3;
  local_78 = pQVar4;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if ((this->linkerResponseFile).filePath.d.size == 0) {
    QVar14.m_size = (size_t)"$(OBJECTS)";
    QVar14.field_0.m_data = &this->objectsLinkLine;
    QString::assign(QVar14);
    goto LAB_001e3f24;
  }
  pQVar5 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  QVar12.m_data = (storage_type *)0x9;
  QVar12.m_size = (qsizetype)local_88;
  QString::fromUtf8(QVar12);
  uVar8 = local_88._0_8_;
  bVar11 = false;
  config.m_data = (storage_type_conflict *)local_88._8_8_;
  config.m_size = (qsizetype)local_78;
  bVar10 = QMakeEvaluator::isActiveConfig(&pQVar5->super_QMakeEvaluator,config,false);
  if (bVar10) {
    pQVar5 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&local_e8,"TEMPLATE");
    QMakeEvaluator::first(&local_b8,&pQVar5->super_QMakeEvaluator,&local_e8);
    bVar11 = ProString::operator==(&local_b8,"lib");
    if (&(local_b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_e8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
    }
  }
  if (bVar11 == false) {
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0xc])(&local_108,this,&this->linkerResponseFile);
    pcStack_70 = local_f8;
    local_78 = (QArrayData *)local_108.alloc;
    uVar8 = local_108._0_8_;
    local_88._0_8_ = "@";
    local_108._0_8_ = (QArrayData *)0x0;
    uVar9 = local_108._0_8_;
    local_108.alloc = 0;
    local_108.ref_._q_value.super___atomic_base<int>._M_i = SUB84(uVar8,0);
    local_108.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = SUB84(uVar8,4);
    local_88._8_4_ = local_108.ref_._q_value.super___atomic_base<int>._M_i;
    local_88._12_4_ =
         local_108.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i;
    local_f8 = (char16_t *)0x0;
    local_108._0_8_ = uVar9;
    QStringBuilder<const_char_(&)[2],_QString>::convertTo<QString>
              ((QString *)&local_178,(QStringBuilder<const_char_(&)[2],_QString> *)local_88);
    pQVar2 = &((this->objectsLinkLine).d.d)->super_QArrayData;
    pcVar6 = (this->objectsLinkLine).d.ptr;
    (this->objectsLinkLine).d.d = local_178.super_ProString.m_string.d.d;
    (this->objectsLinkLine).d.ptr = local_178.super_ProString.m_string.d.ptr;
    qVar7 = (this->objectsLinkLine).d.size;
    (this->objectsLinkLine).d.size = local_178.super_ProString.m_string.d.size;
    local_178.super_ProString.m_string.d.d = (Data *)pQVar2;
    local_178.super_ProString.m_string.d.ptr = pcVar6;
    local_178.super_ProString.m_string.d.size = qVar7;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    if ((QArrayData *)local_88._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      iVar1 = (((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar2 = (QArrayData *)local_88._8_8_;
      goto joined_r0x001e3ee2;
    }
  }
  else {
    local_f8 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_108.alloc = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)local_88,"QMAKE_LIB");
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0x16])(&local_108,this,(ProKey *)local_88);
    if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    if (local_f8 == (char16_t *)0x0) {
      QVar13.m_size = (size_t)"ar -rc";
      QVar13.field_0.m_data = &local_108;
      QString::assign(QVar13);
    }
    ProKey::ProKey(&local_178,"DEST_TARGET");
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0x16])(&local_148,this,&local_178);
    qVar7 = local_138;
    pcVar6 = pcStack_140;
    pQVar2 = local_148;
    local_138 = 0;
    local_148 = (QArrayData *)0x0;
    pcStack_140 = (char16_t *)0x0;
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0xc])(&local_198,this,&this->linkerResponseFile);
    local_48 = local_188;
    pcStack_50 = pcStack_190;
    local_58 = local_198;
    local_88._0_8_ = &local_108;
    local_88[8] = 0x20;
    local_78 = pQVar2;
    pcStack_70 = pcVar6;
    local_68 = qVar7;
    local_60 = (char (*) [3])0x2aad80;
    local_198 = (QArrayData *)0x0;
    pcStack_190 = (char16_t *)0x0;
    local_188 = 0;
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
    ::convertTo<QString>
              (&local_128,
               (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
                *)local_88);
    pQVar2 = &((this->objectsLinkLine).d.d)->super_QArrayData;
    pcVar6 = (this->objectsLinkLine).d.ptr;
    (this->objectsLinkLine).d.d = local_128.d.d;
    (this->objectsLinkLine).d.ptr = local_128.d.ptr;
    qVar7 = (this->objectsLinkLine).d.size;
    (this->objectsLinkLine).d.size = local_128.d.size;
    local_128.d.d = (Data *)pQVar2;
    local_128.d.ptr = pcVar6;
    local_128.d.size = qVar7;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
    ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
                       *)local_88);
    if (local_198 != (QArrayData *)0x0) {
      LOCK();
      (local_198->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_198->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_198->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_198,2,0x10);
      }
    }
    if (local_148 != (QArrayData *)0x0) {
      LOCK();
      (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_148,2,0x10);
      }
    }
    if (&(local_178.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_178.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_178.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_178.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar2 = &(local_178.super_ProString.m_string.d.d)->super_QArrayData;
joined_r0x001e3ee2:
      if (iVar1 == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  if ((QArrayData *)local_108._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_108._0_8_,2,0x10);
    }
  }
LAB_001e3f24:
  Win32MakefileGenerator::writeObjectsPart(&this->super_Win32MakefileGenerator,t);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MingwMakefileGenerator::writeObjectsPart(QTextStream &t)
{
    linkerResponseFile = maybeCreateLinkerResponseFile();
    if (!linkerResponseFile.isValid()) {
        objectsLinkLine = "$(OBJECTS)";
    } else if (project->isActiveConfig("staticlib") && project->first("TEMPLATE") == "lib") {
        // QMAKE_LIB is used for win32, including mingw, whereas QMAKE_AR is used on Unix.
        QString ar_cmd = var("QMAKE_LIB");
        if (ar_cmd.isEmpty())
            ar_cmd = "ar -rc";
        objectsLinkLine = ar_cmd + ' ' + var("DEST_TARGET") + " @"
            + escapeFilePath(linkerResponseFile.filePath);
    } else {
        objectsLinkLine = "@" + escapeFilePath(linkerResponseFile.filePath);
    }
    Win32MakefileGenerator::writeObjectsPart(t);
}